

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O2

void is_suite::is_integer_with_signed_long_int(void)

{
  variable data;
  undefined1 local_3a;
  undefined1 local_39;
  type local_38;
  char local_18;
  
  local_18 = '\b';
  local_38._0_8_ = 2;
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<integer>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x37a,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<signed_char>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x37c,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<signed_char_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed char&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x37d,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_char>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x37e,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_char_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned char&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x37f,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<short>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x380,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<short_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x381,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_short>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x382,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,899,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_int>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,900,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x385,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<long>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x386,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x387,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_long>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x388,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_long_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x389,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<long_long>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x38a,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long_long_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x38b,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_long_long>
                       ((basic_variable<std::allocator<char>_> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x38c,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_long_long_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned long long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x38d,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x38f,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long_const>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x390,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long_const&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x391,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long_volatile>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x392,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>>::is<long_volatile&>
                       ((basic_variable<std::allocator<char>> *)&local_38.__align);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile signed long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x393,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\x02';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed char>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x395,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\x03';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned char>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x396,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\x04';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x397,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\x05';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x398,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\x06';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x399,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\a';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x39a,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\b';
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x39b,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\t';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x39c,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\n';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x39d,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = local_18 == '\v';
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x39e,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x3a0,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const signed long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x3a1,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const signed long int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x3a2,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile signed long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x3a3,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  local_39 = 0;
  local_3a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile signed long int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x3a4,"void is_suite::is_integer_with_signed_long_int()",&local_39,&local_3a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_38.__align);
  return;
}

Assistant:

void is_integer_with_signed_long_int()
{
    variable data(2L);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<integer>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed char>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed char&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned char>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned char&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned long long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned long long int&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile signed long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile signed long int&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed char>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned char>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long long int>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const signed long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const signed long int&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile signed long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile signed long int&>(), false);
}